

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

string * __thiscall
fakeit::DefaultEventFormatter::format_abi_cxx11_
          (string *__return_storage_ptr__,DefaultEventFormatter *this,SequenceVerificationEvent *e)

{
  ostream *poVar1;
  vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> *expectedPattern_00;
  vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> actualSequence;
  vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> expectedPattern;
  ostringstream out;
  string local_1c8;
  _Vector_base<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> local_1a8;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Verification error");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)local_190,"Expected pattern: ");
  std::vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_>::vector
            ((vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> *)&local_1a8,
             (vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> *)(e + 0x28));
  formatExpectedPattern_abi_cxx11_
            (&local_1c8,(DefaultEventFormatter *)&local_1a8,expectedPattern_00);
  poVar1 = std::operator<<((ostream *)local_190,(string *)&local_1c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::operator<<((ostream *)local_190,"Expected matches: ");
  formatExpectedCount((ostream *)local_190,*(VerificationType *)(e + 8),*(int *)(e + 0x58));
  std::endl<char,std::char_traits<char>>((ostream *)local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Actual matches  : ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*(int *)(e + 0x5c));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_>::vector
            ((vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> *)&local_1c8,
             (vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> *)(e + 0x40));
  poVar1 = std::operator<<((ostream *)local_190,"Actual sequence : total of ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," actual invocations");
  if ((pointer)local_1c8._M_string_length == local_1c8._M_dataplus._M_p) {
    std::operator<<((ostream *)local_190,".");
  }
  else {
    poVar1 = std::operator<<((ostream *)local_190,":");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  formatInvocationList
            ((ostream *)local_190,
             (vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::_Vector_base<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_>::~_Vector_base
            ((_Vector_base<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> *)&local_1c8
            );
  std::_Vector_base<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_>::~_Vector_base
            (&local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string format(const SequenceVerificationEvent &e) override {
            std::ostringstream out;
            out << "Verification error" << std::endl;

            out << "Expected pattern: ";
            const std::vector<fakeit::Sequence *> expectedPattern = e.expectedPattern();
            out << formatExpectedPattern(expectedPattern) << std::endl;

            out << "Expected matches: ";
            formatExpectedCount(out, e.verificationType(), e.expectedCount());
            out << std::endl;

            out << "Actual matches  : " << e.actualCount() << std::endl;

            auto actualSequence = e.actualSequence();
            out << "Actual sequence : total of " << actualSequence.size() << " actual invocations";
            if (actualSequence.size() == 0) {
                out << ".";
            } else {
                out << ":" << std::endl;
            }
            formatInvocationList(out, actualSequence);

            return out.str();
        }